

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall
ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
          (ON__CChangeTextureCoordinateHelper *this,int *Fvi,int fvi,float x,float y,float *mesh_T,
          int mesh_T_stride)

{
  int vi;
  int iVar1;
  int *piVar2;
  
  vi = Fvi[fvi];
  if ((mesh_T[vi * mesh_T_stride] == x) && (!NAN(mesh_T[vi * mesh_T_stride]) && !NAN(x))) {
    if ((y == -1.234321e+38) && (!NAN(y))) {
      return;
    }
    if ((mesh_T[(long)(vi * mesh_T_stride) + 1] == y) &&
       (!NAN(mesh_T[(long)(vi * mesh_T_stride) + 1]) && !NAN(y))) {
      return;
    }
  }
  iVar1 = DupVertex(this,vi);
  mesh_T[mesh_T_stride * iVar1] = x;
  if ((y != -1.234321e+38) || (NAN(y))) {
    mesh_T[(long)(mesh_T_stride * iVar1) + 1] = y;
  }
  piVar2 = Fvi + fvi;
  if ((fvi == 2) && (vi == Fvi[3])) {
    Fvi[2] = iVar1;
    piVar2 = Fvi + 3;
  }
  *piVar2 = iVar1;
  return;
}

Assistant:

void ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate(int* Fvi, int fvi, float x, float y,
                                                             float* mesh_T, int mesh_T_stride )
{
  int oldvi = Fvi[fvi];
  float* T = mesh_T+(oldvi*mesh_T_stride);
  if ( x != T[0] || (y != ON_UNSET_FLOAT && y != T[1]) )
  {
    int newvi = DupVertex(oldvi);
    T = mesh_T + (newvi*mesh_T_stride);
    T[0] = x;
    if ( y != ON_UNSET_FLOAT )
     T[1] = y;

    if ( 2 == fvi && oldvi == Fvi[3] )
    {
      Fvi[2] = newvi;
      Fvi[3] = newvi;
    }
    else
    {
      Fvi[fvi] = newvi;
    }
  }
}